

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9ReadVer(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Io_FileType_t FileType;
  char *pcVar2;
  FILE *__stream;
  Abc_Ntk_t *pNtk;
  Gia_Man_t *pNew;
  uint fVerbose;
  char *pcVar3;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 != -1) {
    iVar1 = -2;
    Abc_Print(-2,"usage: &read_ver [-vh] <file>\n");
    Abc_Print(-2,"\t         a specialized reader for hierarchical Verilog files\n");
    pcVar3 = "yes";
    if (fVerbose == 0) {
      pcVar3 = "no";
    }
    Abc_Print(-2,"\t-v     : toggles additional verbose output [default = %s]\n",pcVar3);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    pcVar3 = "\t<file> : the file name\n";
    goto LAB_00245b94;
  }
  if (argc - globalUtilOptind == 1) {
    pcVar3 = argv[globalUtilOptind];
    pcVar2 = pcVar3;
    do {
      if (*pcVar2 == '>') {
        *pcVar2 = '\\';
      }
      else if (*pcVar2 == '\0') goto LAB_00245bab;
      pcVar2 = pcVar2 + 1;
    } while( true );
  }
  pcVar3 = "There is no file name.\n";
  goto LAB_00245b91;
LAB_00245bab:
  __stream = fopen(pcVar3,"r");
  if (__stream == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar3);
    pcVar3 = Extra_FileGetSimilarName(pcVar3,".v",".blif",(char *)0x0,(char *)0x0,(char *)0x0);
    if (pcVar3 != (char *)0x0) {
      Abc_Print(1,"Did you mean \"%s\"?",pcVar3);
    }
    Abc_Print(1,"\n");
    return 1;
  }
  fclose(__stream);
  FileType = Io_ReadFileType(pcVar3);
  pNtk = Io_ReadNetlist(pcVar3,FileType,0);
  if (pNtk != (Abc_Ntk_t *)0x0) {
    pNew = Abc_NtkFlattenHierarchyGia(pNtk,(Vec_Ptr_t **)0x0,fVerbose);
    Abc_NtkDelete(pNtk);
    Abc_FrameUpdateGia(pAbc,pNew);
    return 0;
  }
  pcVar3 = "Reading hierarchical Verilog has failed.\n";
LAB_00245b91:
  iVar1 = -1;
LAB_00245b94:
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAbc9ReadVer( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    Gia_Man_t * pAig;
    FILE * pFile;
    char ** pArgvNew;
    char * pFileName, * pTemp;
    int nArgcNew;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "There is no file name.\n" );
        return 1;
    }

    // get the input file name
    pFileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = pFileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( pFileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".v", ".blif", NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", pFileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    // read hierarchical Verilog
    pNtk = Io_ReadNetlist( pFileName, Io_ReadFileType(pFileName), 0 );
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Reading hierarchical Verilog has failed.\n" );
        return 1;
    }
    pAig = Abc_NtkFlattenHierarchyGia( pNtk, NULL, fVerbose );
    Abc_NtkDelete( pNtk );
    Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    Abc_Print( -2, "usage: &read_ver [-vh] <file>\n" );
    Abc_Print( -2, "\t         a specialized reader for hierarchical Verilog files\n" );
    Abc_Print( -2, "\t-v     : toggles additional verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}